

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_27f4c0::PeerManagerImpl::UpdateBlockAvailability
          (PeerManagerImpl *this,NodeId nodeid,uint256 *hash)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  int iVar4;
  _Base_ptr p_Var5;
  CBlockIndex *pCVar6;
  _Base_ptr p_Var7;
  long in_FS_OFFSET;
  base_uint<256U> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var5 = (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 == (_Base_ptr)0x0) {
LAB_001d98a9:
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x5ce,
                  "void (anonymous namespace)::PeerManagerImpl::UpdateBlockAvailability(NodeId, const uint256 &)"
                 );
  }
  p_Var1 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header;
  p_Var7 = &p_Var1->_M_header;
  do {
    if (nodeid <= *(long *)(p_Var5 + 1)) {
      p_Var7 = p_Var5;
    }
    p_Var5 = (&p_Var5->_M_left)[*(long *)(p_Var5 + 1) < nodeid];
  } while (p_Var5 != (_Base_ptr)0x0);
  if (((_Rb_tree_header *)p_Var7 == p_Var1) || (nodeid < *(long *)(p_Var7 + 1))) goto LAB_001d98a9;
  ProcessBlockAvailability(this,nodeid);
  pCVar6 = ::node::BlockManager::LookupBlockIndex(&this->m_chainman->m_blockman,hash);
  if (pCVar6 != (CBlockIndex *)0x0) {
    local_48.pn[4] = 0;
    local_48.pn[5] = 0;
    local_48.pn[6] = 0;
    local_48.pn[7] = 0;
    local_48.pn[0] = 0;
    local_48.pn[1] = 0;
    local_48.pn[2] = 0;
    local_48.pn[3] = 0;
    iVar4 = base_uint<256U>::CompareTo(&(pCVar6->nChainWork).super_base_uint<256U>,&local_48);
    if (0 < iVar4) {
      if (p_Var7[1]._M_parent != (_Base_ptr)0x0) {
        iVar4 = base_uint<256U>::CompareTo
                          (&(pCVar6->nChainWork).super_base_uint<256U>,
                           (base_uint<256U> *)&p_Var7[1]._M_parent[1]._M_parent);
        if (iVar4 < 0) goto LAB_001d988d;
      }
      p_Var7[1]._M_parent = (_Base_ptr)pCVar6;
      goto LAB_001d988d;
    }
  }
  p_Var5 = *(_Base_ptr *)(hash->super_base_blob<256U>).m_data._M_elems;
  p_Var2 = *(_Base_ptr *)((hash->super_base_blob<256U>).m_data._M_elems + 8);
  p_Var3 = *(_Base_ptr *)((hash->super_base_blob<256U>).m_data._M_elems + 0x18);
  *(undefined8 *)(p_Var7 + 2) =
       *(undefined8 *)((hash->super_base_blob<256U>).m_data._M_elems + 0x10);
  p_Var7[2]._M_parent = p_Var3;
  p_Var7[1]._M_left = p_Var5;
  p_Var7[1]._M_right = p_Var2;
LAB_001d988d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::UpdateBlockAvailability(NodeId nodeid, const uint256 &hash) {
    CNodeState *state = State(nodeid);
    assert(state != nullptr);

    ProcessBlockAvailability(nodeid);

    const CBlockIndex* pindex = m_chainman.m_blockman.LookupBlockIndex(hash);
    if (pindex && pindex->nChainWork > 0) {
        // An actually better block was announced.
        if (state->pindexBestKnownBlock == nullptr || pindex->nChainWork >= state->pindexBestKnownBlock->nChainWork) {
            state->pindexBestKnownBlock = pindex;
        }
    } else {
        // An unknown block was announced; just assume that the latest one is the best one.
        state->hashLastUnknownBlock = hash;
    }
}